

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall
httplib::ClientImpl::redirect(ClientImpl *this,Request *req,Response *res,Error *error)

{
  bool bVar1;
  __type _Var2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  char *pcVar6;
  const_reference pvVar7;
  allocator local_4c9;
  string local_4c8;
  undefined1 local_4a8 [8];
  ClientImpl cli;
  undefined1 local_198 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> path;
  undefined1 local_170 [4];
  int next_port;
  string_type next_query;
  string_type next_path;
  string_type port_str;
  undefined1 local_f0 [8];
  string_type next_host;
  string_type next_scheme;
  char *scheme;
  smatch m;
  allocator local_71;
  string local_70;
  undefined1 local_50 [8];
  string location;
  Error *error_local;
  Response *res_local;
  Request *req_local;
  ClientImpl *this_local;
  
  if (req->redirect_count_ == 0) {
    *error = ExceedRedirectCount;
    this_local._7_1_ = false;
  }
  else {
    location.field_2._8_8_ = error;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_70,"location",&local_71);
    Response::get_header_value((string *)local_50,res,&local_70,0);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      if ((redirect(httplib::Request&,httplib::Response&,httplib::Error&)::re_abi_cxx11_ == '\0') &&
         (iVar3 = __cxa_guard_acquire(&redirect(httplib::Request&,httplib::Response&,httplib::Error&)
                                       ::re_abi_cxx11_), iVar3 != 0)) {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  (&redirect(httplib::Request&,httplib::Response&,httplib::Error&)::re_abi_cxx11_,
                   "(?:(https?):)?(?://(?:\\[([\\d:]+)\\]|([^:/?#]+))(?::(\\d+))?)?([^?#]*)(\\?[^#]*)?(?:#.*)?"
                   ,0x10);
        __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                     ~basic_regex,
                     &redirect(httplib::Request&,httplib::Response&,httplib::Error&)::re_abi_cxx11_,
                     &__dso_handle);
        __cxa_guard_release(&redirect(httplib::Request&,httplib::Response&,httplib::Error&)::
                             re_abi_cxx11_);
      }
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)&scheme);
      bVar1 = std::
              regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_50,(match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   *)&scheme,
                         &redirect(httplib::Request&,httplib::Response&,httplib::Error&)::
                          re_abi_cxx11_,0);
      if (bVar1) {
        uVar4 = (*this->_vptr_ClientImpl[6])();
        pcVar6 = "http";
        if ((uVar4 & 1) != 0) {
          pcVar6 = "https";
        }
        pvVar7 = std::__cxx11::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)&scheme,1);
        std::__cxx11::
        sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::str((string_type *)((long)&next_host.field_2 + 8),pvVar7);
        pvVar7 = std::__cxx11::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)&scheme,2);
        std::__cxx11::
        sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::str((string_type *)local_f0,pvVar7);
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) != 0) {
          pvVar7 = std::__cxx11::
                   match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 *)&scheme,3);
          std::__cxx11::
          sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::str((string_type *)((long)&port_str.field_2 + 8),pvVar7);
          std::__cxx11::string::operator=
                    ((string *)local_f0,(string *)(port_str.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(port_str.field_2._M_local_buf + 8));
        }
        pvVar7 = std::__cxx11::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)&scheme,4);
        std::__cxx11::
        sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::str((string_type *)((long)&next_path.field_2 + 8),pvVar7);
        pvVar7 = std::__cxx11::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)&scheme,5);
        std::__cxx11::
        sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::str((string_type *)((long)&next_query.field_2 + 8),pvVar7);
        pvVar7 = std::__cxx11::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)&scheme,6);
        std::__cxx11::
        sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::str((string_type *)local_170,pvVar7);
        path.field_2._12_4_ = this->port_;
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          path.field_2._12_4_ =
               std::__cxx11::stoi((string *)((long)&next_path.field_2 + 8),(size_t *)0x0,10);
        }
        else {
          uVar5 = std::__cxx11::string::empty();
          if ((uVar5 & 1) == 0) {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&next_host.field_2 + 8),"https");
            path.field_2._12_4_ = 0x50;
            if (bVar1) {
              path.field_2._12_4_ = 0x1bb;
            }
          }
        }
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) != 0) {
          std::__cxx11::string::operator=((string *)(next_host.field_2._M_local_buf + 8),pcVar6);
        }
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) != 0) {
          std::__cxx11::string::operator=((string *)local_f0,(string *)&this->host_);
        }
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) != 0) {
          std::__cxx11::string::operator=((string *)(next_query.field_2._M_local_buf + 8),"/");
        }
        detail::decode_url((string *)&cli.logger_._M_invoker,
                           (string *)((long)&next_query.field_2 + 8),true);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_198,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &cli.logger_._M_invoker,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_170);
        std::__cxx11::string::~string((string *)&cli.logger_._M_invoker);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&next_host.field_2 + 8),pcVar6);
        if (((bVar1) &&
            (_Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_f0,&this->host_), _Var2)) &&
           (path.field_2._12_4_ == this->port_)) {
          this_local._7_1_ =
               detail::redirect<httplib::ClientImpl>
                         (this,req,res,(string *)local_198,(string *)local_50,
                          (Error *)location.field_2._8_8_);
          m._M_begin._M_current._0_4_ = 1;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&next_host.field_2 + 8),"https");
          if (bVar1) {
            this_local._7_1_ = false;
            m._M_begin._M_current._0_4_ = 1;
          }
          else {
            pcVar6 = (char *)std::__cxx11::string::c_str();
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_4c8,pcVar6,&local_4c9);
            ClientImpl((ClientImpl *)local_4a8,&local_4c8,path.field_2._12_4_);
            std::__cxx11::string::~string((string *)&local_4c8);
            std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
            copy_settings((ClientImpl *)local_4a8,this);
            this_local._7_1_ =
                 detail::redirect<httplib::ClientImpl>
                           ((ClientImpl *)local_4a8,req,res,(string *)local_198,(string *)local_50,
                            (Error *)location.field_2._8_8_);
            m._M_begin._M_current._0_4_ = 1;
            ~ClientImpl((ClientImpl *)local_4a8);
          }
        }
        std::__cxx11::string::~string((string *)local_198);
        std::__cxx11::string::~string((string *)local_170);
        std::__cxx11::string::~string((string *)(next_query.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(next_path.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_f0);
        std::__cxx11::string::~string((string *)(next_host.field_2._M_local_buf + 8));
      }
      else {
        this_local._7_1_ = false;
        m._M_begin._M_current._0_4_ = 1;
      }
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)&scheme);
    }
    else {
      this_local._7_1_ = false;
      m._M_begin._M_current._0_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_50);
  }
  return this_local._7_1_;
}

Assistant:

inline bool ClientImpl::redirect(Request &req, Response &res, Error &error) {
  if (req.redirect_count_ == 0) {
    error = Error::ExceedRedirectCount;
    return false;
  }

  auto location = res.get_header_value("location");
  if (location.empty()) { return false; }

  const static std::regex re(
      R"((?:(https?):)?(?://(?:\[([\d:]+)\]|([^:/?#]+))(?::(\d+))?)?([^?#]*)(\?[^#]*)?(?:#.*)?)");

  std::smatch m;
  if (!std::regex_match(location, m, re)) { return false; }

  auto scheme = is_ssl() ? "https" : "http";

  auto next_scheme = m[1].str();
  auto next_host = m[2].str();
  if (next_host.empty()) { next_host = m[3].str(); }
  auto port_str = m[4].str();
  auto next_path = m[5].str();
  auto next_query = m[6].str();

  auto next_port = port_;
  if (!port_str.empty()) {
    next_port = std::stoi(port_str);
  } else if (!next_scheme.empty()) {
    next_port = next_scheme == "https" ? 443 : 80;
  }

  if (next_scheme.empty()) { next_scheme = scheme; }
  if (next_host.empty()) { next_host = host_; }
  if (next_path.empty()) { next_path = "/"; }

  auto path = detail::decode_url(next_path, true) + next_query;

  if (next_scheme == scheme && next_host == host_ && next_port == port_) {
    return detail::redirect(*this, req, res, path, location, error);
  } else {
    if (next_scheme == "https") {
#ifdef CPPHTTPLIB_OPENSSL_SUPPORT
      SSLClient cli(next_host.c_str(), next_port);
      cli.copy_settings(*this);
      if (ca_cert_store_) { cli.set_ca_cert_store(ca_cert_store_); }
      return detail::redirect(cli, req, res, path, location, error);
#else
      return false;
#endif
    } else {
      ClientImpl cli(next_host.c_str(), next_port);
      cli.copy_settings(*this);
      return detail::redirect(cli, req, res, path, location, error);
    }
  }
}